

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O0

Matrix4x4 * CMU462::Matrix4x4::translation(Vector3D *t)

{
  double dVar1;
  double *pdVar2;
  Matrix4x4 *in_RSI;
  Matrix4x4 *in_RDI;
  Matrix4x4 *B;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  Matrix4x4 *in_stack_ffffffffffffffc0;
  Matrix4x4 *this;
  
  Matrix4x4(in_RSI);
  pdVar2 = operator()(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
  ;
  *pdVar2 = 1.0;
  pdVar2 = operator()(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
  ;
  *pdVar2 = 0.0;
  pdVar2 = operator()(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
  ;
  *pdVar2 = 0.0;
  this = (Matrix4x4 *)in_RSI->entries[0].x;
  pdVar2 = operator()(this,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  *pdVar2 = (double)this;
  pdVar2 = operator()(this,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  *pdVar2 = 0.0;
  pdVar2 = operator()(this,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  *pdVar2 = 1.0;
  pdVar2 = operator()(this,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  *pdVar2 = 0.0;
  dVar1 = in_RSI->entries[0].y;
  pdVar2 = operator()(this,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  *pdVar2 = dVar1;
  pdVar2 = operator()(this,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  *pdVar2 = 0.0;
  pdVar2 = operator()(this,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  *pdVar2 = 0.0;
  pdVar2 = operator()(this,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  *pdVar2 = 1.0;
  dVar1 = in_RSI->entries[0].z;
  pdVar2 = operator()(this,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  *pdVar2 = dVar1;
  pdVar2 = operator()(this,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  *pdVar2 = 0.0;
  pdVar2 = operator()(this,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  *pdVar2 = 0.0;
  pdVar2 = operator()(this,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  *pdVar2 = 0.0;
  pdVar2 = operator()(this,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  *pdVar2 = 1.0;
  return in_RDI;
}

Assistant:

Matrix4x4 Matrix4x4::translation(Vector3D t) {
    Matrix4x4 B;

    B(0, 0) = 1.; B(0, 1) = 0.; B(0, 2) = 0.; B(0, 3) = t.x;
    B(1, 0) = 0.; B(1, 1) = 1.; B(1, 2) = 0.; B(1, 3) = t.y;
    B(2, 0) = 0.; B(2, 1) = 0.; B(2, 2) = 1.; B(2, 3) = t.z;
    B(3, 0) = 0.; B(3, 1) = 0.; B(3, 2) = 0.; B(3, 3) = 1.;

    return B;
  }